

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O2

void __thiscall WalkerManager::GenNewWaler(WalkerManager *this)

{
  int iVar1;
  shared_ptr<MWakler> walker;
  __shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::make_shared<MWakler>();
  std::__shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_28,&local_38);
  UpdateRandSpeed((shared_ptr<MWakler> *)&local_28,4.0,4.0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  iVar1 = this->nextID;
  this->nextID = iVar1 + 1;
  (local_38._M_ptr)->idx = iVar1;
  std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>::push_back
            (&this->walkers,(value_type *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void GenNewWaler()
    {
        std::shared_ptr<MWakler> walker = std::make_shared<MWakler>();
        UpdateRandSpeed(walker);
        walker->idx = nextID++;

        walkers.push_back(walker);
    }